

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Type dg::vr::Relations::getStrict(Type type)

{
  if (type - SLE < 8) {
    return *(Type *)(&DAT_001021a4 + (ulong)(type - SLE) * 4);
  }
  abort();
}

Assistant:

Relations::Type Relations::getStrict(Type type) {
    switch (type) {
    case Relations::SLT:
    case Relations::SLE:
        return Relations::SLT;
    case Relations::ULT:
    case Relations::ULE:
        return Relations::ULT;
    case Relations::SGT:
    case Relations::SGE:
        return Relations::SGT;
    case Relations::UGT:
    case Relations::UGE:
        return Relations::UGT;
    default:
        assert(0 && "no strict variant");
        abort();
    }
}